

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_257,_false,_embree::avx2::VirtualCurveIntersectorK<4>,_true>::
     occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  byte bVar1;
  BVH *bvh;
  NodeRef root;
  ulong uVar2;
  void *pvVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  long lVar7;
  size_t k;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined8 uVar15;
  undefined8 uVar16;
  vbool<4> vVar17;
  char cVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  size_t mask;
  ulong uVar22;
  undefined4 uVar23;
  ulong uVar24;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar25;
  ulong uVar26;
  NodeRef *pNVar27;
  bool bVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float fVar60;
  float fVar64;
  float fVar65;
  float fVar66;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  vfloat4 a0;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar86 [64];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar87;
  undefined1 auVar88 [16];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  vbool<4> terminated;
  vbool<4> valid_o;
  TravRayK<4,_false> tray;
  Precalculations pre;
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  undefined1 auVar77 [64];
  undefined1 auVar81 [64];
  undefined1 auVar85 [64];
  
  uVar16 = mm_lookupmask_ps._8_8_;
  uVar15 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    auVar41 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar51 = vpcmpeqd_avx(auVar41,(undefined1  [16])valid_i->field_0);
    auVar41 = *(undefined1 (*) [16])(ray + 0x80);
    auVar32 = ZEXT816(0) << 0x40;
    auVar39 = vcmpps_avx(auVar41,auVar32,5);
    auVar39 = vandps_avx(auVar39,auVar51);
    auVar90 = ZEXT1664(auVar39);
    uVar19 = vmovmskps_avx(auVar39);
    if (uVar19 != 0) {
      uVar22 = (ulong)(uVar19 & 0xff);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar51._0_4_ = tray.dir.field_0._32_4_ * tray.dir.field_0._32_4_;
      auVar51._4_4_ = tray.dir.field_0._36_4_ * tray.dir.field_0._36_4_;
      auVar51._8_4_ = tray.dir.field_0._40_4_ * tray.dir.field_0._40_4_;
      auVar51._12_4_ = tray.dir.field_0._44_4_ * tray.dir.field_0._44_4_;
      auVar51 = vfmadd231ps_fma(auVar51,(undefined1  [16])tray.dir.field_0.field_0.y.field_0,
                                (undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar53 = vfmadd231ps_fma(auVar51,(undefined1  [16])tray.dir.field_0.field_0.x.field_0,
                                (undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar51 = vrsqrtps_avx(auVar53);
      fVar60 = auVar51._0_4_;
      fVar64 = auVar51._4_4_;
      fVar65 = auVar51._8_4_;
      fVar66 = auVar51._12_4_;
      auVar52._0_4_ = fVar60 * fVar60 * fVar60 * auVar53._0_4_ * -0.5;
      auVar52._4_4_ = fVar64 * fVar64 * fVar64 * auVar53._4_4_ * -0.5;
      auVar52._8_4_ = fVar65 * fVar65 * fVar65 * auVar53._8_4_ * -0.5;
      auVar52._12_4_ = fVar66 * fVar66 * fVar66 * auVar53._12_4_ * -0.5;
      auVar67._8_4_ = 0x3fc00000;
      auVar67._0_8_ = 0x3fc000003fc00000;
      auVar67._12_4_ = 0x3fc00000;
      pre.depth_scale.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vfmadd213ps_fma(auVar67,auVar51,auVar52);
      auVar53._8_4_ = 0x80000000;
      auVar53._0_8_ = 0x8000000080000000;
      auVar53._12_4_ = 0x80000000;
      do {
        lVar7 = 0;
        for (uVar26 = uVar22; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
          lVar7 = lVar7 + 1;
        }
        uVar26 = (ulong)(uint)((int)lVar7 * 4);
        auVar51 = vinsertps_avx(ZEXT416(*(uint *)(ray + uVar26 + 0x40)),
                                ZEXT416(*(uint *)(ray + uVar26 + 0x50)),0x1c);
        auVar51 = vinsertps_avx(auVar51,ZEXT416(*(uint *)(ray + uVar26 + 0x60)),0x28);
        fVar60 = *(float *)((long)pre.ray_space + (uVar26 - 0x10));
        auVar73._0_4_ = auVar51._0_4_ * fVar60;
        auVar73._4_4_ = auVar51._4_4_ * fVar60;
        auVar73._8_4_ = auVar51._8_4_ * fVar60;
        auVar73._12_4_ = auVar51._12_4_ * fVar60;
        auVar52 = vshufpd_avx(auVar73,auVar73,1);
        auVar51 = vmovshdup_avx(auVar73);
        auVar78._0_4_ = auVar51._0_4_ ^ 0x80000000;
        auVar51 = vunpckhps_avx(auVar73,auVar32);
        auVar78._4_12_ = ZEXT812(0) << 0x20;
        auVar74._0_8_ = auVar52._0_8_ ^ 0x8000000080000000;
        auVar74._8_8_ = auVar52._8_8_ ^ auVar53._8_8_;
        auVar67 = vinsertps_avx(auVar74,auVar73,0x2a);
        auVar70 = vshufps_avx(auVar51,auVar78,0x41);
        auVar51 = vdpps_avx(auVar67,auVar67,0x7f);
        auVar52 = vdpps_avx(auVar70,auVar70,0x7f);
        auVar51 = vcmpps_avx(auVar51,auVar52,1);
        auVar82._0_4_ = auVar51._0_4_;
        auVar82._4_4_ = auVar82._0_4_;
        auVar82._8_4_ = auVar82._0_4_;
        auVar82._12_4_ = auVar82._0_4_;
        auVar51 = vblendvps_avx(auVar67,auVar70,auVar82);
        auVar52 = vdpps_avx(auVar51,auVar51,0x7f);
        auVar67 = vrsqrtss_avx(auVar52,auVar52);
        fVar64 = auVar67._0_4_;
        fVar64 = fVar64 * 1.5 - auVar52._0_4_ * 0.5 * fVar64 * fVar64 * fVar64;
        auVar75._0_4_ = auVar51._0_4_ * fVar64;
        auVar75._4_4_ = auVar51._4_4_ * fVar64;
        auVar75._8_4_ = auVar51._8_4_ * fVar64;
        auVar75._12_4_ = auVar51._12_4_ * fVar64;
        auVar51 = vshufps_avx(auVar75,auVar75,0xc9);
        auVar52 = vshufps_avx(auVar73,auVar73,0xc9);
        auVar83._0_4_ = auVar75._0_4_ * auVar52._0_4_;
        auVar83._4_4_ = auVar75._4_4_ * auVar52._4_4_;
        auVar83._8_4_ = auVar75._8_4_ * auVar52._8_4_;
        auVar83._12_4_ = auVar75._12_4_ * auVar52._12_4_;
        auVar51 = vfmsub231ps_fma(auVar83,auVar73,auVar51);
        auVar67 = vshufps_avx(auVar51,auVar51,0xc9);
        auVar51 = vdpps_avx(auVar67,auVar67,0x7f);
        auVar52 = vrsqrtss_avx(auVar51,auVar51);
        fVar64 = auVar52._0_4_;
        fVar64 = fVar64 * 1.5 - auVar51._0_4_ * 0.5 * fVar64 * fVar64 * fVar64;
        uVar22 = uVar22 - 1 & uVar22;
        auVar79._0_4_ = fVar64 * auVar67._0_4_;
        auVar79._4_4_ = fVar64 * auVar67._4_4_;
        auVar79._8_4_ = fVar64 * auVar67._8_4_;
        auVar79._12_4_ = fVar64 * auVar67._12_4_;
        auVar70._0_4_ = fVar60 * auVar73._0_4_;
        auVar70._4_4_ = fVar60 * auVar73._4_4_;
        auVar70._8_4_ = fVar60 * auVar73._8_4_;
        auVar70._12_4_ = fVar60 * auVar73._12_4_;
        auVar67 = vunpcklps_avx(auVar75,auVar70);
        auVar51 = vunpckhps_avx(auVar75,auVar70);
        auVar70 = vunpcklps_avx(auVar79,auVar32);
        auVar52 = vunpckhps_avx(auVar79,auVar32);
        aVar5 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar51,auVar52);
        aVar6 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar67,auVar70);
        aVar4 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpckhps_avx(auVar67,auVar70);
        pre.ray_space[lVar7].vx.field_0 = aVar6;
        pre.ray_space[lVar7].vy.field_0 = aVar4;
        pre.ray_space[lVar7].vz.field_0 = aVar5;
      } while (uVar22 != 0);
      tray.org.field_0._0_4_ = *(undefined4 *)ray;
      tray.org.field_0._4_4_ = *(undefined4 *)(ray + 4);
      tray.org.field_0._8_4_ = *(undefined4 *)(ray + 8);
      tray.org.field_0._12_4_ = *(undefined4 *)(ray + 0xc);
      tray.org.field_0._16_4_ = *(undefined4 *)(ray + 0x10);
      tray.org.field_0._20_4_ = *(undefined4 *)(ray + 0x14);
      tray.org.field_0._24_4_ = *(undefined4 *)(ray + 0x18);
      tray.org.field_0._28_4_ = *(undefined4 *)(ray + 0x1c);
      tray.org.field_0._32_4_ = *(undefined4 *)(ray + 0x20);
      tray.org.field_0._36_4_ = *(undefined4 *)(ray + 0x24);
      tray.org.field_0._40_4_ = *(undefined4 *)(ray + 0x28);
      tray.org.field_0._44_4_ = *(undefined4 *)(ray + 0x2c);
      auVar76._8_4_ = 0x7fffffff;
      auVar76._0_8_ = 0x7fffffff7fffffff;
      auVar76._12_4_ = 0x7fffffff;
      auVar77 = ZEXT1664(auVar76);
      auVar51 = vandps_avx(auVar76,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar80._8_4_ = 0x219392ef;
      auVar80._0_8_ = 0x219392ef219392ef;
      auVar80._12_4_ = 0x219392ef;
      auVar81 = ZEXT1664(auVar80);
      auVar51 = vcmpps_avx(auVar51,auVar80,1);
      auVar32 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar80,auVar51);
      auVar51 = vandps_avx(auVar76,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar51 = vcmpps_avx(auVar51,auVar80,1);
      auVar53 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar80,auVar51);
      auVar51 = vandps_avx(auVar76,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar51 = vcmpps_avx(auVar51,auVar80,1);
      auVar51 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar80,auVar51);
      auVar52 = vrcpps_avx(auVar32);
      auVar84._8_4_ = 0x3f800000;
      auVar84._0_8_ = &DAT_3f8000003f800000;
      auVar84._12_4_ = 0x3f800000;
      auVar85 = ZEXT1664(auVar84);
      auVar32 = vfnmadd213ps_fma(auVar32,auVar52,auVar84);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar32,auVar52,auVar52)
      ;
      auVar32 = vrcpps_avx(auVar53);
      auVar53 = vfnmadd213ps_fma(auVar53,auVar32,auVar84);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar53,auVar32,auVar32)
      ;
      auVar32 = vrcpps_avx(auVar51);
      auVar51 = vfnmadd213ps_fma(auVar51,auVar32,auVar84);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar51,auVar32,auVar32)
      ;
      tray.org_rdir.field_0._0_4_ = (float)tray.org.field_0._0_4_ * tray.rdir.field_0._0_4_;
      tray.org_rdir.field_0._4_4_ = (float)tray.org.field_0._4_4_ * tray.rdir.field_0._4_4_;
      tray.org_rdir.field_0._8_4_ = (float)tray.org.field_0._8_4_ * tray.rdir.field_0._8_4_;
      tray.org_rdir.field_0._12_4_ = (float)tray.org.field_0._12_4_ * tray.rdir.field_0._12_4_;
      tray.org_rdir.field_0._16_4_ = (float)tray.org.field_0._16_4_ * tray.rdir.field_0._16_4_;
      tray.org_rdir.field_0._20_4_ = (float)tray.org.field_0._20_4_ * tray.rdir.field_0._20_4_;
      tray.org_rdir.field_0._24_4_ = (float)tray.org.field_0._24_4_ * tray.rdir.field_0._24_4_;
      tray.org_rdir.field_0._28_4_ = (float)tray.org.field_0._28_4_ * tray.rdir.field_0._28_4_;
      tray.org_rdir.field_0._32_4_ = (float)tray.org.field_0._32_4_ * tray.rdir.field_0._32_4_;
      tray.org_rdir.field_0._36_4_ = (float)tray.org.field_0._36_4_ * tray.rdir.field_0._36_4_;
      tray.org_rdir.field_0._40_4_ = (float)tray.org.field_0._40_4_ * tray.rdir.field_0._40_4_;
      tray.org_rdir.field_0._44_4_ = (float)tray.org.field_0._44_4_ * tray.rdir.field_0._44_4_;
      auVar32 = ZEXT416(0) << 0x20;
      auVar51 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar32,1);
      auVar54._8_4_ = 0x20;
      auVar54._0_8_ = 0x2000000020;
      auVar54._12_4_ = 0x20;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar51,auVar54);
      auVar51 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar32,5);
      auVar55._8_4_ = 0x40;
      auVar55._0_8_ = 0x4000000040;
      auVar55._12_4_ = 0x40;
      auVar61._8_4_ = 0x60;
      auVar61._0_8_ = 0x6000000060;
      auVar61._12_4_ = 0x60;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar61,auVar55,auVar51);
      auVar51 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar32,5);
      auVar37._8_4_ = 0x80;
      auVar37._0_8_ = 0x8000000080;
      auVar37._12_4_ = 0x80;
      auVar42._8_4_ = 0xa0;
      auVar42._0_8_ = 0xa0000000a0;
      auVar42._12_4_ = 0xa0;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar42,auVar37,auVar51);
      auVar51 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar32);
      auVar41 = vmaxps_avx(auVar41,auVar32);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar86 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar51,auVar39);
      auVar32._8_4_ = 0xff800000;
      auVar32._0_8_ = 0xff800000ff800000;
      auVar32._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar32,auVar41,auVar39);
      auVar41 = vpcmpeqd_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])tray.tfar.field_0
                            );
      terminated.field_0._0_4_ = auVar39._0_4_ ^ auVar41._0_4_;
      terminated.field_0._4_4_ = auVar39._4_4_ ^ auVar41._4_4_;
      terminated.field_0._8_4_ = auVar39._8_4_ ^ auVar41._8_4_;
      terminated.field_0._12_4_ = auVar39._12_4_ ^ auVar41._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar19 = 3;
      }
      else {
        uVar19 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pNVar27 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar25 = &stack_near[2].field_0;
      stack_node[1].ptr = (bvh->root).ptr;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      do {
        paVar25 = &((vfloat<4> *)paVar25)[-1].field_0;
        root.ptr = pNVar27[-1].ptr;
        pNVar27 = pNVar27 + -1;
        if (root.ptr == 0xfffffffffffffff8) {
LAB_00633ccb:
          iVar21 = 3;
        }
        else {
          aVar87 = *paVar25;
          auVar41 = vcmpps_avx((undefined1  [16])aVar87,(undefined1  [16])tray.tfar.field_0,1);
          uVar20 = vmovmskps_avx(auVar41);
          if (uVar20 == 0) {
            iVar21 = 2;
          }
          else {
            uVar22 = (ulong)(uVar20 & 0xff);
            uVar20 = POPCOUNT(uVar20 & 0xff);
            iVar21 = 0;
            if (uVar20 <= uVar19) {
              do {
                k = 0;
                for (uVar26 = uVar22; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000)
                {
                  k = k + 1;
                }
                bVar28 = occluded1(This,bvh,root,k,&pre,ray,&tray,context);
                if (bVar28) {
                  terminated.field_0.i[k] = -1;
                }
                uVar22 = uVar22 - 1 & uVar22;
              } while (uVar22 != 0);
              auVar41 = _DAT_01febe20 & ~(undefined1  [16])terminated.field_0;
              iVar21 = 3;
              auVar90 = ZEXT1664(auVar90._0_16_);
              auVar77 = ZEXT1664(auVar77._0_16_);
              auVar81 = ZEXT1664(CONCAT412(0x219392ef,CONCAT48(0x219392ef,0x219392ef219392ef)));
              auVar85 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,&DAT_3f8000003f800000)));
              auVar86 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              if ((((auVar41 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar41 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar41 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar41[0xf] < '\0') {
                auVar41._8_4_ = 0xff800000;
                auVar41._0_8_ = 0xff800000ff800000;
                auVar41._12_4_ = 0xff800000;
                tray.tfar.field_0 =
                     (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar41,
                                   (undefined1  [16])terminated.field_0);
                iVar21 = 2;
              }
            }
            vVar17.field_0 = terminated.field_0;
            if (uVar19 < uVar20) {
              auVar41 = auVar77._0_16_;
              do {
                if ((root.ptr & 8) != 0) {
                  if (root.ptr != 0xfffffffffffffff8) {
                    auVar39 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,
                                         (undefined1  [16])aVar87,6);
                    if ((((auVar39 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                         (auVar39 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar39 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        -1 < auVar39[0xf]) {
                      iVar21 = 2;
                    }
                    else {
                      bVar1 = *(byte *)(root.ptr & 0xfffffffffffffff0);
                      pvVar3 = This->leafIntersector;
                      valid_o.field_0._0_8_ = uVar15;
                      valid_o.field_0._8_8_ = uVar16;
                      uVar20 = vmovmskps_avx((undefined1  [16])terminated.field_0);
                      if ((uVar20 ^ 0xf) != 0) {
                        uVar22 = (ulong)(byte)(uVar20 ^ 0xf);
                        do {
                          lVar7 = 0;
                          for (uVar26 = uVar22; (uVar26 & 1) == 0;
                              uVar26 = uVar26 >> 1 | 0x8000000000000000) {
                            lVar7 = lVar7 + 1;
                          }
                          cVar18 = (**(code **)((long)pvVar3 + (ulong)bVar1 * 0x40 + 0x18))
                                             (&pre,ray,lVar7,context,
                                              (byte *)(root.ptr & 0xfffffffffffffff0));
                          if (cVar18 != '\0') {
                            valid_o.field_0.i[lVar7] = -1;
                          }
                          uVar22 = uVar22 - 1 & uVar22;
                        } while (uVar22 != 0);
                      }
                      auVar8._8_8_ = valid_o.field_0._8_8_;
                      auVar8._0_8_ = valid_o.field_0._0_8_;
                      terminated.field_0 =
                           (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                           vorps_avx((undefined1  [16])vVar17.field_0,auVar8);
                      auVar39 = _DAT_01febe20 & ~(undefined1  [16])terminated.field_0;
                      if ((((auVar39 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                           (auVar39 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar39 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          -1 < auVar39[0xf]) {
                        iVar21 = 3;
                      }
                      else {
                        auVar88._8_4_ = 0xff800000;
                        auVar88._0_8_ = 0xff800000ff800000;
                        auVar88._12_4_ = 0xff800000;
                        tray.tfar.field_0 =
                             (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                             vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar88,
                                           (undefined1  [16])terminated.field_0);
                        iVar21 = 0;
                      }
                    }
                    auVar90 = ZEXT1664(auVar90._0_16_);
                    auVar77 = ZEXT1664(auVar41);
                    auVar81 = ZEXT1664(CONCAT412(0x219392ef,CONCAT48(0x219392ef,0x219392ef219392ef))
                                      );
                    auVar85 = ZEXT1664(CONCAT412(0x3f800000,
                                                 CONCAT48(0x3f800000,&DAT_3f8000003f800000)));
                    auVar86 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000))
                                      );
                    break;
                  }
                  goto LAB_00633ccb;
                }
                uVar24 = root.ptr & 0xfffffffffffffff0;
                auVar89 = ZEXT1664(auVar86._0_16_);
                uVar22 = 0;
                uVar26 = 8;
                do {
                  uVar2 = *(ulong *)(uVar24 + uVar22 * 8);
                  if (uVar2 != 8) {
                    if ((root.ptr & 7) == 0) {
                      uVar23 = *(undefined4 *)(root.ptr + 0x40 + uVar22 * 4);
                      auVar38._4_4_ = uVar23;
                      auVar38._0_4_ = uVar23;
                      auVar38._8_4_ = uVar23;
                      auVar38._12_4_ = uVar23;
                      auVar12._4_4_ = tray.org_rdir.field_0._4_4_;
                      auVar12._0_4_ = tray.org_rdir.field_0._0_4_;
                      auVar12._8_4_ = tray.org_rdir.field_0._8_4_;
                      auVar12._12_4_ = tray.org_rdir.field_0._12_4_;
                      auVar40 = vfmsub213ps_fma(auVar38,(undefined1  [16])
                                                        tray.rdir.field_0.field_0.x.field_0,auVar12)
                      ;
                      uVar23 = *(undefined4 *)(root.ptr + 0x80 + uVar22 * 4);
                      auVar33._4_4_ = uVar23;
                      auVar33._0_4_ = uVar23;
                      auVar33._8_4_ = uVar23;
                      auVar33._12_4_ = uVar23;
                      auVar13._4_4_ = tray.org_rdir.field_0._20_4_;
                      auVar13._0_4_ = tray.org_rdir.field_0._16_4_;
                      auVar13._8_4_ = tray.org_rdir.field_0._24_4_;
                      auVar13._12_4_ = tray.org_rdir.field_0._28_4_;
                      auVar35 = vfmsub213ps_fma(auVar33,(undefined1  [16])
                                                        tray.rdir.field_0.field_0.y.field_0,auVar13)
                      ;
                      uVar23 = *(undefined4 *)(root.ptr + 0xc0 + uVar22 * 4);
                      auVar29._4_4_ = uVar23;
                      auVar29._0_4_ = uVar23;
                      auVar29._8_4_ = uVar23;
                      auVar29._12_4_ = uVar23;
                      auVar14._4_4_ = tray.org_rdir.field_0._36_4_;
                      auVar14._0_4_ = tray.org_rdir.field_0._32_4_;
                      auVar14._8_4_ = tray.org_rdir.field_0._40_4_;
                      auVar14._12_4_ = tray.org_rdir.field_0._44_4_;
                      auVar31 = vfmsub213ps_fma(auVar29,(undefined1  [16])
                                                        tray.rdir.field_0.field_0.z.field_0,auVar14)
                      ;
                      uVar23 = *(undefined4 *)(root.ptr + 0x60 + uVar22 * 4);
                      auVar43._4_4_ = uVar23;
                      auVar43._0_4_ = uVar23;
                      auVar43._8_4_ = uVar23;
                      auVar43._12_4_ = uVar23;
                      auVar46 = vfmsub213ps_fma(auVar43,(undefined1  [16])
                                                        tray.rdir.field_0.field_0.x.field_0,auVar12)
                      ;
                      uVar23 = *(undefined4 *)(root.ptr + 0xa0 + uVar22 * 4);
                      auVar47._4_4_ = uVar23;
                      auVar47._0_4_ = uVar23;
                      auVar47._8_4_ = uVar23;
                      auVar47._12_4_ = uVar23;
                      auVar50 = vfmsub213ps_fma(auVar47,(undefined1  [16])
                                                        tray.rdir.field_0.field_0.y.field_0,auVar13)
                      ;
                      uVar23 = *(undefined4 *)(root.ptr + 0xe0 + uVar22 * 4);
                      auVar56._4_4_ = uVar23;
                      auVar56._0_4_ = uVar23;
                      auVar56._8_4_ = uVar23;
                      auVar56._12_4_ = uVar23;
                      auVar59 = vfmsub213ps_fma(auVar56,(undefined1  [16])
                                                        tray.rdir.field_0.field_0.z.field_0,auVar14)
                      ;
                    }
                    else {
                      uVar23 = *(undefined4 *)(uVar24 + 0xa0 + uVar22 * 4);
                      auVar57._4_4_ = uVar23;
                      auVar57._0_4_ = uVar23;
                      auVar57._8_4_ = uVar23;
                      auVar57._12_4_ = uVar23;
                      uVar23 = *(undefined4 *)(uVar24 + 0xc0 + uVar22 * 4);
                      auVar48._4_4_ = uVar23;
                      auVar48._0_4_ = uVar23;
                      auVar48._8_4_ = uVar23;
                      auVar48._12_4_ = uVar23;
                      uVar23 = *(undefined4 *)(uVar24 + 0xe0 + uVar22 * 4);
                      auVar44._4_4_ = uVar23;
                      auVar44._0_4_ = uVar23;
                      auVar44._8_4_ = uVar23;
                      auVar44._12_4_ = uVar23;
                      fVar60 = *(float *)(uVar24 + 0x100 + uVar22 * 4);
                      auVar62._4_4_ = fVar60;
                      auVar62._0_4_ = fVar60;
                      auVar62._8_4_ = fVar60;
                      auVar62._12_4_ = fVar60;
                      fVar64 = *(float *)(uVar24 + 0x120 + uVar22 * 4);
                      auVar68._4_4_ = fVar64;
                      auVar68._0_4_ = fVar64;
                      auVar68._8_4_ = fVar64;
                      auVar68._12_4_ = fVar64;
                      fVar65 = *(float *)(uVar24 + 0x140 + uVar22 * 4);
                      auVar71._4_4_ = fVar65;
                      auVar71._0_4_ = fVar65;
                      auVar71._8_4_ = fVar65;
                      auVar71._12_4_ = fVar65;
                      uVar23 = *(undefined4 *)(uVar24 + 0x160 + uVar22 * 4);
                      auVar39._4_4_ = uVar23;
                      auVar39._0_4_ = uVar23;
                      auVar39._8_4_ = uVar23;
                      auVar39._12_4_ = uVar23;
                      uVar23 = *(undefined4 *)(uVar24 + 0x180 + uVar22 * 4);
                      auVar34._4_4_ = uVar23;
                      auVar34._0_4_ = uVar23;
                      auVar34._8_4_ = uVar23;
                      auVar34._12_4_ = uVar23;
                      uVar23 = *(undefined4 *)(uVar24 + 0x1a0 + uVar22 * 4);
                      auVar30._4_4_ = uVar23;
                      auVar30._0_4_ = uVar23;
                      auVar30._8_4_ = uVar23;
                      auVar30._12_4_ = uVar23;
                      auVar11._4_4_ = tray.org.field_0._36_4_;
                      auVar11._0_4_ = tray.org.field_0._32_4_;
                      auVar11._8_4_ = tray.org.field_0._40_4_;
                      auVar11._12_4_ = tray.org.field_0._44_4_;
                      auVar39 = vfmadd231ps_fma(auVar39,auVar11,auVar62);
                      auVar51 = vfmadd231ps_fma(auVar34,auVar11,auVar68);
                      auVar32 = vfmadd231ps_fma(auVar30,auVar11,auVar71);
                      auVar63._0_4_ = (float)tray.dir.field_0._32_4_ * fVar60;
                      auVar63._4_4_ = (float)tray.dir.field_0._36_4_ * fVar60;
                      auVar63._8_4_ = (float)tray.dir.field_0._40_4_ * fVar60;
                      auVar63._12_4_ = (float)tray.dir.field_0._44_4_ * fVar60;
                      auVar69._0_4_ = (float)tray.dir.field_0._32_4_ * fVar64;
                      auVar69._4_4_ = (float)tray.dir.field_0._36_4_ * fVar64;
                      auVar69._8_4_ = (float)tray.dir.field_0._40_4_ * fVar64;
                      auVar69._12_4_ = (float)tray.dir.field_0._44_4_ * fVar64;
                      auVar72._0_4_ = fVar65 * (float)tray.dir.field_0._32_4_;
                      auVar72._4_4_ = fVar65 * (float)tray.dir.field_0._36_4_;
                      auVar72._8_4_ = fVar65 * (float)tray.dir.field_0._40_4_;
                      auVar72._12_4_ = fVar65 * (float)tray.dir.field_0._44_4_;
                      auVar53 = vfmadd231ps_fma(auVar63,(undefined1  [16])
                                                        tray.dir.field_0.field_0.y.field_0,auVar57);
                      auVar52 = vfmadd231ps_fma(auVar69,(undefined1  [16])
                                                        tray.dir.field_0.field_0.y.field_0,auVar48);
                      auVar67 = vfmadd231ps_fma(auVar72,auVar44,
                                                (undefined1  [16])tray.dir.field_0.field_0.y.field_0
                                               );
                      auVar10._4_4_ = tray.org.field_0._20_4_;
                      auVar10._0_4_ = tray.org.field_0._16_4_;
                      auVar10._8_4_ = tray.org.field_0._24_4_;
                      auVar10._12_4_ = tray.org.field_0._28_4_;
                      auVar70 = vfmadd231ps_fma(auVar39,auVar10,auVar57);
                      uVar23 = *(undefined4 *)(uVar24 + 0x40 + uVar22 * 4);
                      auVar58._4_4_ = uVar23;
                      auVar58._0_4_ = uVar23;
                      auVar58._8_4_ = uVar23;
                      auVar58._12_4_ = uVar23;
                      auVar73 = vfmadd231ps_fma(auVar51,auVar10,auVar48);
                      uVar23 = *(undefined4 *)(uVar24 + 0x60 + uVar22 * 4);
                      auVar49._4_4_ = uVar23;
                      auVar49._0_4_ = uVar23;
                      auVar49._8_4_ = uVar23;
                      auVar49._12_4_ = uVar23;
                      auVar74 = vfmadd231ps_fma(auVar32,auVar10,auVar44);
                      uVar23 = *(undefined4 *)(uVar24 + 0x80 + uVar22 * 4);
                      auVar45._4_4_ = uVar23;
                      auVar45._0_4_ = uVar23;
                      auVar45._8_4_ = uVar23;
                      auVar45._12_4_ = uVar23;
                      auVar51 = vfmadd231ps_fma(auVar53,(undefined1  [16])
                                                        tray.dir.field_0.field_0.x.field_0,auVar58);
                      auVar32 = vfmadd231ps_fma(auVar52,(undefined1  [16])
                                                        tray.dir.field_0.field_0.x.field_0,auVar49);
                      auVar53 = vfmadd231ps_fma(auVar67,auVar45,
                                                (undefined1  [16])tray.dir.field_0.field_0.x.field_0
                                               );
                      auVar39 = vandps_avx(auVar41,auVar51);
                      auVar52 = auVar81._0_16_;
                      auVar39 = vcmpps_avx(auVar39,auVar52,1);
                      auVar51 = vblendvps_avx(auVar51,auVar52,auVar39);
                      auVar39 = vandps_avx(auVar41,auVar32);
                      auVar39 = vcmpps_avx(auVar39,auVar52,1);
                      auVar32 = vblendvps_avx(auVar32,auVar52,auVar39);
                      auVar39 = vandps_avx(auVar53,auVar41);
                      auVar39 = vcmpps_avx(auVar39,auVar52,1);
                      auVar39 = vblendvps_avx(auVar53,auVar52,auVar39);
                      auVar53 = vrcpps_avx(auVar51);
                      auVar52 = auVar85._0_16_;
                      auVar51 = vfnmadd213ps_fma(auVar51,auVar53,auVar52);
                      auVar53 = vfmadd132ps_fma(auVar51,auVar53,auVar53);
                      auVar51 = vrcpps_avx(auVar32);
                      auVar32 = vfnmadd213ps_fma(auVar32,auVar51,auVar52);
                      auVar32 = vfmadd132ps_fma(auVar32,auVar51,auVar51);
                      auVar51 = vrcpps_avx(auVar39);
                      auVar39 = vfnmadd213ps_fma(auVar39,auVar51,auVar52);
                      auVar39 = vfmadd132ps_fma(auVar39,auVar51,auVar51);
                      auVar9._4_4_ = tray.org.field_0._4_4_;
                      auVar9._0_4_ = tray.org.field_0._0_4_;
                      auVar9._8_4_ = tray.org.field_0._8_4_;
                      auVar9._12_4_ = tray.org.field_0._12_4_;
                      auVar51 = vfmadd231ps_fma(auVar70,auVar9,auVar58);
                      auVar52 = vfmadd231ps_fma(auVar73,auVar9,auVar49);
                      auVar67 = vfmadd231ps_fma(auVar74,auVar9,auVar45);
                      auVar40._0_4_ = auVar51._0_4_ * -auVar53._0_4_;
                      auVar40._4_4_ = auVar51._4_4_ * -auVar53._4_4_;
                      auVar40._8_4_ = auVar51._8_4_ * -auVar53._8_4_;
                      auVar40._12_4_ = auVar51._12_4_ * -auVar53._12_4_;
                      auVar35._0_4_ = auVar52._0_4_ * -auVar32._0_4_;
                      auVar35._4_4_ = auVar52._4_4_ * -auVar32._4_4_;
                      auVar35._8_4_ = auVar52._8_4_ * -auVar32._8_4_;
                      auVar35._12_4_ = auVar52._12_4_ * -auVar32._12_4_;
                      auVar31._0_4_ = auVar67._0_4_ * -auVar39._0_4_;
                      auVar31._4_4_ = auVar67._4_4_ * -auVar39._4_4_;
                      auVar31._8_4_ = auVar67._8_4_ * -auVar39._8_4_;
                      auVar31._12_4_ = auVar67._12_4_ * -auVar39._12_4_;
                      auVar46._0_4_ = auVar53._0_4_ + auVar40._0_4_;
                      auVar46._4_4_ = auVar53._4_4_ + auVar40._4_4_;
                      auVar46._8_4_ = auVar53._8_4_ + auVar40._8_4_;
                      auVar46._12_4_ = auVar53._12_4_ + auVar40._12_4_;
                      auVar50._0_4_ = auVar32._0_4_ + auVar35._0_4_;
                      auVar50._4_4_ = auVar32._4_4_ + auVar35._4_4_;
                      auVar50._8_4_ = auVar32._8_4_ + auVar35._8_4_;
                      auVar50._12_4_ = auVar32._12_4_ + auVar35._12_4_;
                      auVar59._0_4_ = auVar39._0_4_ + auVar31._0_4_;
                      auVar59._4_4_ = auVar39._4_4_ + auVar31._4_4_;
                      auVar59._8_4_ = auVar39._8_4_ + auVar31._8_4_;
                      auVar59._12_4_ = auVar39._12_4_ + auVar31._12_4_;
                    }
                    auVar39 = vpminsd_avx(auVar40,auVar46);
                    auVar51 = vpminsd_avx(auVar35,auVar50);
                    auVar39 = vpmaxsd_avx(auVar39,auVar51);
                    auVar51 = vpminsd_avx(auVar31,auVar59);
                    auVar51 = vpmaxsd_avx(auVar39,auVar51);
                    auVar39 = vpmaxsd_avx(auVar40,auVar46);
                    auVar32 = vpmaxsd_avx(auVar35,auVar50);
                    auVar32 = vpminsd_avx(auVar39,auVar32);
                    auVar39 = vpmaxsd_avx(auVar31,auVar59);
                    auVar32 = vpminsd_avx(auVar32,auVar39);
                    auVar39 = vpmaxsd_avx(auVar51,(undefined1  [16])tray.tnear.field_0);
                    auVar32 = vpminsd_avx(auVar32,(undefined1  [16])tray.tfar.field_0);
                    auVar39 = vcmpps_avx(auVar39,auVar32,2);
                    if ((((auVar39 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar39 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar39 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        auVar39[0xf] < '\0') {
                      auVar39 = vblendvps_avx(auVar86._0_16_,auVar51,auVar39);
                      if (uVar26 != 8) {
                        pNVar27->ptr = uVar26;
                        pNVar27 = pNVar27 + 1;
                        *paVar25 = auVar89._0_16_;
                        paVar25 = paVar25 + 1;
                      }
                      auVar89 = ZEXT1664(auVar39);
                      uVar26 = uVar2;
                    }
                  }
                  aVar87 = auVar89._0_16_;
                } while ((uVar2 != 8) && (bVar28 = uVar22 < 7, uVar22 = uVar22 + 1, bVar28));
                iVar21 = 0;
                if (uVar26 == 8) {
LAB_00633b80:
                  bVar28 = false;
                  iVar21 = 4;
                }
                else {
                  auVar39 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar87,
                                       6);
                  uVar23 = vmovmskps_avx(auVar39);
                  bVar28 = true;
                  if ((uint)POPCOUNT(uVar23) <= uVar19) {
                    pNVar27->ptr = uVar26;
                    pNVar27 = pNVar27 + 1;
                    *paVar25 = aVar87;
                    paVar25 = paVar25 + 1;
                    goto LAB_00633b80;
                  }
                }
                root.ptr = uVar26;
              } while (bVar28);
            }
          }
        }
      } while (iVar21 != 3);
      auVar41 = vandps_avx(auVar90._0_16_,(undefined1  [16])terminated.field_0);
      auVar36._8_4_ = 0xff800000;
      auVar36._0_8_ = 0xff800000ff800000;
      auVar36._12_4_ = 0xff800000;
      auVar41 = vmaskmovps_avx(auVar41,auVar36);
      *(undefined1 (*) [16])(ray + 0x80) = auVar41;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }